

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int updatewindow(z_streamp strm,uint out)

{
  internal_state *piVar1;
  uint uVar2;
  void *__dest;
  uint uVar3;
  uint uVar4;
  
  piVar1 = strm->state;
  __dest = *(void **)(piVar1 + 0x10);
  if (__dest == (void *)0x0) {
    __dest = (*strm->zalloc)(strm->opaque,1 << ((byte)piVar1[0xc].dummy & 0x1f),1);
    *(void **)(piVar1 + 0x10) = __dest;
    if (__dest == (voidpf)0x0) {
      return 1;
    }
  }
  uVar4 = piVar1[0xd].dummy;
  if (uVar4 == 0) {
    uVar4 = 1 << ((byte)piVar1[0xc].dummy & 0x1f);
    piVar1[0xd].dummy = uVar4;
    *(undefined8 *)(piVar1 + 0xe) = 0;
  }
  uVar3 = out - strm->avail_out;
  if (uVar3 < uVar4) {
    uVar4 = uVar4 - piVar1[0xf].dummy;
    uVar2 = uVar3;
    if (uVar4 < uVar3) {
      uVar2 = uVar4;
    }
    memcpy((void *)((long)__dest + (ulong)(uint)piVar1[0xf].dummy),strm->next_out + -(ulong)uVar3,
           (ulong)uVar2);
    if (uVar3 <= uVar4) {
      uVar4 = piVar1[0xf].dummy + uVar2;
      if (uVar4 == piVar1[0xd].dummy) {
        uVar4 = 0;
      }
      piVar1[0xf].dummy = uVar4;
      if ((uint)piVar1[0xd].dummy <= (uint)piVar1[0xe].dummy) {
        return 0;
      }
      piVar1[0xe].dummy = piVar1[0xe].dummy + uVar2;
      return 0;
    }
    uVar3 = uVar3 - uVar2;
    memcpy(*(void **)(piVar1 + 0x10),strm->next_out + -(ulong)uVar3,(ulong)uVar3);
    piVar1[0xf].dummy = uVar3;
  }
  else {
    memcpy(__dest,strm->next_out + -(ulong)uVar4,(ulong)uVar4);
    piVar1[0xf].dummy = 0;
  }
  piVar1[0xe].dummy = piVar1[0xd].dummy;
  return 0;
}

Assistant:

local int updatewindow(strm, out)
z_streamp strm;
unsigned out;
{
    struct inflate_state FAR *state;
    unsigned copy, dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->write = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    copy = out - strm->avail_out;
    if (copy >= state->wsize) {
        zmemcpy(state->window, strm->next_out - state->wsize, state->wsize);
        state->write = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->write;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->write, strm->next_out - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, strm->next_out - copy, copy);
            state->write = copy;
            state->whave = state->wsize;
        }
        else {
            state->write += dist;
            if (state->write == state->wsize) state->write = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}